

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool GUIComponentParse(uint32_t line_number,string *gui_component_line,string *uniform_line,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *previous_components,
                      GUIComponent *out_component,string *out_parse_error)

{
  __type _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_type sVar7;
  reference pvVar8;
  reference pGVar9;
  bool bVar10;
  GUIComponent *previous_component;
  const_iterator __end1;
  const_iterator __begin1;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string uniform_type;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string error;
  int scanned;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string component_data;
  string component_name;
  uint32_t current_char;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  anon_class_16_2_f93b81b2 ReportError;
  string *out_parse_error_local;
  GUIComponent *out_component_local;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *previous_components_local;
  string *uniform_line_local;
  string *gui_component_line_local;
  uint32_t line_number_local;
  
  ReportError.out_parse_error = (string *)&gui_component_line_local;
  local_48 = (undefined1  [8])out_parse_error;
  ReportError.line_number = (uint32_t *)out_parse_error;
  gui_component_line_local._0_4_ = line_number;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::operator+(&local_88,"GUI type not associated with any uniform \'",gui_component_line);
    std::operator+(&local_68,&local_88,"\'");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    gui_component_line_local._7_1_ = 0;
    goto LAB_001112c3;
  }
  component_name.field_2._8_4_ = 0;
  while( true ) {
    uVar4 = std::__cxx11::string::size();
    bVar10 = false;
    if ((uint)component_name.field_2._8_4_ < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)gui_component_line);
      bVar10 = *pcVar5 != '(';
    }
    if (!bVar10) break;
    component_name.field_2._8_4_ = component_name.field_2._8_4_ + 1;
  }
  std::__cxx11::string::substr((ulong)((long)&component_data.field_2 + 8),(ulong)gui_component_line)
  ;
  std::__cxx11::string::substr((ulong)local_d8,(ulong)gui_component_line);
  bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&component_data.field_2 + 8),"slider1");
  if (bVar10) {
    out_component->Type = EGUIComponentTypeSlider1;
LAB_00110954:
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar10 = GUIIsSliderType(out_component->Type);
      if (bVar10) {
        uVar6 = std::__cxx11::string::c_str();
        error.field_2._8_4_ =
             __isoc99_sscanf(uVar6,"(%f, %f)",&out_component->field_4,
                             (undefined1 *)((long)&out_component->field_4 + 4));
        if (error.field_2._8_4_ != 2) {
          std::__cxx11::string::string((string *)local_140);
          std::operator+(&local_180,"Invalid format for GUI component data \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8);
          std::operator+(&local_160,&local_180,"\'\n");
          std::__cxx11::string::operator+=((string *)local_140,(string *)&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &uniform_tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"Format should be @",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&component_data.field_2 + 8));
          std::operator+(&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &uniform_tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "(start_range, end_range)");
          std::__cxx11::string::operator+=((string *)local_140,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string
                    ((string *)
                     &uniform_tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                    ((anon_class_16_2_f93b81b2 *)local_48,(string *)local_140);
          gui_component_line_local._7_1_ = 0;
          error.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_140);
          goto LAB_0011128f;
        }
      }
    }
    else {
      bVar10 = GUIIsSliderType(out_component->Type);
      if (bVar10) {
        (out_component->field_4).SliderRange.Start = 0.0;
        (out_component->field_4).SliderRange.End = 1.0;
      }
    }
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8,uniform_line,' ');
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1d8);
    if (sVar7 == 3) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d8,0);
      bVar10 = std::operator!=(pvVar8,"uniform");
      if (bVar10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"GUI type not associated with a uniform",
                   (allocator<char> *)(uniform_type.field_2._M_local_buf + 0xf));
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                  ((anon_class_16_2_f93b81b2 *)local_48,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(uniform_type.field_2._M_local_buf + 0xf));
        gui_component_line_local._7_1_ = 0;
        error.field_2._12_4_ = 1;
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d8,1);
        std::__cxx11::string::string((string *)local_248,(string *)pvVar8);
        bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_248,"float");
        if (bVar10) {
          out_component->UniformType = EGUIUniformTypeFloat;
LAB_00110f65:
          uVar2 = GUIComponents(out_component->Type);
          uVar3 = GUIUniformVariableComponents(out_component->UniformType);
          if (uVar2 == uVar3) {
            while( true ) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d8);
              pcVar5 = (char *)std::__cxx11::string::back();
              if (*pcVar5 != ';') break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d8);
              std::__cxx11::string::pop_back();
            }
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d8);
            std::__cxx11::string::operator=((string *)&out_component->UniformName,(string *)pvVar8);
            bVar10 = std::operator==(&out_component->UniformName,"time");
            if ((bVar10) ||
               (bVar10 = std::operator==(&out_component->UniformName,"resolution"), bVar10)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2d0,"GUI type not allowed for builtin uniforms",
                         (allocator<char> *)((long)&__range1 + 7));
              GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                        ((anon_class_16_2_f93b81b2 *)local_48,&local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
              gui_component_line_local._7_1_ = 0;
            }
            else {
              __end1 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin
                                 (previous_components);
              previous_component =
                   (GUIComponent *)
                   std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end
                             (previous_components);
              while (bVar10 = __gnu_cxx::operator!=
                                        (&__end1,(__normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                                  *)&previous_component), bVar10) {
                pGVar9 = __gnu_cxx::
                         __normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                         ::operator*(&__end1);
                _Var1 = std::operator==(&pGVar9->UniformName,&out_component->UniformName);
                if (_Var1) {
                  *(undefined8 *)out_component->Data = *(undefined8 *)pGVar9->Data;
                  *(undefined8 *)(out_component->Data + 2) = *(undefined8 *)(pGVar9->Data + 2);
                }
                __gnu_cxx::
                __normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                ::operator++(&__end1);
              }
              gui_component_line_local._7_1_ = 1;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,
                       "GUI component count does not match uniform component count",&local_2a9);
            GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                      ((anon_class_16_2_f93b81b2 *)local_48,&local_2a8);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::allocator<char>::~allocator(&local_2a9);
            gui_component_line_local._7_1_ = 0;
          }
        }
        else {
          bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248,"vec2");
          if (bVar10) {
            out_component->UniformType = EGUIUniformTypeVec2;
            goto LAB_00110f65;
          }
          bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248,"vec3");
          if (bVar10) {
            out_component->UniformType = EGUIUniformTypeVec3;
            goto LAB_00110f65;
          }
          bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248,"vec4");
          if (bVar10) {
            out_component->UniformType = EGUIUniformTypeVec4;
            goto LAB_00110f65;
          }
          std::operator+(&local_288,"GUI not supported for uniform type \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_248);
          std::operator+(&local_268,&local_288,"\'");
          GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                    ((anon_class_16_2_f93b81b2 *)local_48,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_288);
          gui_component_line_local._7_1_ = 0;
        }
        error.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"GUI associated with invalid uniform",&local_1f9);
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                ((anon_class_16_2_f93b81b2 *)local_48,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      gui_component_line_local._7_1_ = 0;
      error.field_2._12_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
  }
  else {
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&component_data.field_2 + 8),"slider2");
    if (bVar10) {
      out_component->Type = EGUIComponentTypeSlider2;
      goto LAB_00110954;
    }
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&component_data.field_2 + 8),"slider3");
    if (bVar10) {
      out_component->Type = EGUIComponentTypeSlider3;
      goto LAB_00110954;
    }
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&component_data.field_2 + 8),"slider4");
    if (bVar10) {
      out_component->Type = EGUIComponentTypeSlider4;
      goto LAB_00110954;
    }
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&component_data.field_2 + 8),"color3");
    if (bVar10) {
      out_component->Type = EGUIComponentTypeColor3;
      goto LAB_00110954;
    }
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&component_data.field_2 + 8),"color4");
    if (bVar10) {
      out_component->Type = EGUIComponentTypeColor4;
      goto LAB_00110954;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scanned,
                   "Invalid GUI type name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&component_data.field_2 + 8));
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scanned,
                   "\'");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)local_48,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&scanned);
    gui_component_line_local._7_1_ = 0;
    error.field_2._12_4_ = 1;
  }
LAB_0011128f:
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(component_data.field_2._M_local_buf + 8));
LAB_001112c3:
  return (bool)(gui_component_line_local._7_1_ & 1);
}

Assistant:

bool GUIComponentParse(uint32_t line_number, const std::string& gui_component_line, const std::string& uniform_line, const std::vector<GUIComponent>& previous_components, GUIComponent& out_component, std::string& out_parse_error) {
    auto ReportError = [&](const std::string& error) {
        out_parse_error = error + " at line " + std::to_string(line_number);
    };
    if (uniform_line.empty()) {
        ReportError("GUI type not associated with any uniform '" + gui_component_line + "'");
        return false;
    }
    uint32_t current_char = 0;
    while (current_char < gui_component_line.size() && gui_component_line[current_char] != '(') {
        ++current_char;
    }

    std::string component_name = gui_component_line.substr(0, current_char);
    std::string component_data = gui_component_line.substr(current_char, std::string::npos);
    if (component_name == "slider1") {
        out_component.Type = EGUIComponentTypeSlider1;
    } else if (component_name == "slider2") {
        out_component.Type = EGUIComponentTypeSlider2;
    } else if (component_name == "slider3") {
        out_component.Type = EGUIComponentTypeSlider3;
    } else if (component_name == "slider4") {
        out_component.Type = EGUIComponentTypeSlider4;
    } else if (component_name == "color3") {
        out_component.Type = EGUIComponentTypeColor3;
    } else if (component_name == "color4") {
        out_component.Type = EGUIComponentTypeColor4;
    } else {
        ReportError("Invalid GUI type name '" + component_name + "'");
        return false;
    }

    if (!component_data.empty()) {
        if (GUIIsSliderType(out_component.Type)) {
            int scanned = sscanf(component_data.c_str(), "(%f, %f)",
                &out_component.SliderRange.Start,
                &out_component.SliderRange.End);
            if (scanned != 2) {
                std::string error;
                error += "Invalid format for GUI component data '" + component_data + "'\n";
                error += "Format should be @" + component_name + "(start_range, end_range)";
                ReportError(error);
                return false;
            }
        }
    } else {
        // Initialize the data with convenient defaults
        if (GUIIsSliderType(out_component.Type)) {
            out_component.SliderRange.Start = 0.0f;
            out_component.SliderRange.End = 1.0f;
        }
    }

    std::vector<std::string> uniform_tokens = SplitString(uniform_line,  ' ');
    if (uniform_tokens.size() != 3) {
        ReportError("GUI associated with invalid uniform");
        return false;
    }

    if (uniform_tokens[0] != "uniform") {
        ReportError("GUI type not associated with a uniform");
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type == "float") {
        out_component.UniformType = EGUIUniformTypeFloat;
    } else if (uniform_type == "vec2") {
        out_component.UniformType = EGUIUniformTypeVec2;
    } else if (uniform_type == "vec3") {
        out_component.UniformType = EGUIUniformTypeVec3;
    } else if (uniform_type == "vec4") {
        out_component.UniformType = EGUIUniformTypeVec4;
    } else {
        ReportError("GUI not supported for uniform type '" + uniform_type + "'");
        return false;
    }

    if (GUIComponents(out_component.Type) != GUIUniformVariableComponents(out_component.UniformType)) {
        ReportError("GUI component count does not match uniform component count");
        return false;
    }

    // Trim semicolon ';'
    while (uniform_tokens.back().back() == ';') {
        uniform_tokens.back().pop_back();
    }

    out_component.UniformName = uniform_tokens.back();

    if (out_component.UniformName == "time" || out_component.UniformName == "resolution") {
        ReportError("GUI type not allowed for builtin uniforms");
        return false;
    }

    for (const GUIComponent& previous_component : previous_components) {
        if (previous_component.UniformName == out_component.UniformName) {
            memcpy(&out_component.Data, &previous_component.Data, sizeof(out_component.Data));
        }
    }
    return true;
}